

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
fasttext::FastText::getAnalogies(FastText *this,int32_t k,string *wordA,string *wordB,string *wordC)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ulong uVar1;
  int32_t k_00;
  bool bVar2;
  type __comp;
  string *in_RCX;
  undefined4 in_EDX;
  FastText *in_RDI;
  string *this_00;
  string *in_R8;
  string *in_R9;
  real rVar3;
  real rVar4;
  real rVar5;
  Vector buffer;
  Vector query;
  unique_ptr<fasttext::Matrix,_std::default_delete<fasttext::Matrix>_> *in_stack_fffffffffffffe60;
  Vector *in_stack_fffffffffffffe70;
  Vector *in_stack_fffffffffffffe80;
  Vector *in_stack_fffffffffffffe88;
  string *psVar6;
  FastText *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  FastText *this_01;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [24];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff48;
  string local_b0 [4];
  Vector *query_00;
  Matrix *in_stack_ffffffffffffff60;
  FastText *in_stack_ffffffffffffff68;
  
  this_01 = in_RDI;
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x165685);
  Vector::Vector((Vector *)in_stack_fffffffffffffe90,(int64_t)in_stack_fffffffffffffe88);
  Vector::zero(in_stack_fffffffffffffe70);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1656b7);
  Vector::Vector((Vector *)in_stack_fffffffffffffe90,(int64_t)in_stack_fffffffffffffe88);
  getWordVector(this_01,(Vector *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                (string *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  rVar3 = Vector::norm(in_stack_fffffffffffffe80);
  Vector::addVector((Vector *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                    (real)((ulong)in_stack_fffffffffffffe80 >> 0x20));
  getWordVector(this_01,(Vector *)CONCAT44(rVar3,in_stack_fffffffffffffeb8),
                (string *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  rVar4 = Vector::norm(in_stack_fffffffffffffe80);
  Vector::addVector((Vector *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                    (real)((ulong)in_stack_fffffffffffffe80 >> 0x20));
  getWordVector(this_01,(Vector *)CONCAT44(rVar3,rVar4),
                (string *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  rVar5 = Vector::norm(in_stack_fffffffffffffe80);
  Vector::addVector((Vector *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                    (real)((ulong)in_stack_fffffffffffffe80 >> 0x20));
  lazyComputeWordVectors(in_stack_fffffffffffffe90);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<fasttext::Matrix,_std::default_delete<fasttext::Matrix>_> *)
                     0x165831);
  if (!bVar2) {
    __assert_fail("wordVectors_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/fasttext.cc"
                  ,0x263,
                  "std::vector<std::pair<real, std::string>> fasttext::FastText::getAnalogies(int32_t, const std::string &, const std::string &, const std::string &)"
                 );
  }
  __comp = std::unique_ptr<fasttext::Matrix,_std::default_delete<fasttext::Matrix>_>::operator*
                     (in_stack_fffffffffffffe60);
  std::__cxx11::string::string(local_110,in_RCX);
  std::__cxx11::string::string(local_f0,in_R8);
  std::__cxx11::string::string(local_d0,in_R9);
  _local_b0 = local_110;
  query_00 = (Vector *)0x3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x165938);
  __l._M_array._4_4_ = rVar3;
  __l._M_array._0_4_ = rVar4;
  __l._M_len = (size_type)this_01;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT44(rVar5,in_stack_fffffffffffffeb0),__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        __comp,(allocator_type *)CONCAT44(in_EDX,in_stack_fffffffffffffea0));
  psVar6 = _local_b0;
  uVar1 = (ulong)_local_b0 >> 0x20;
  k_00 = (int32_t)uVar1;
  _local_b0 = psVar6;
  getNN(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,query_00,k_00,in_stack_ffffffffffffff48)
  ;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x16599c);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1659a9);
  psVar6 = local_110;
  this_00 = local_b0;
  do {
    this_00 = this_00 + -0x20;
    std::__cxx11::string::~string(this_00);
  } while (this_00 != psVar6);
  Vector::~Vector((Vector *)0x1659f3);
  Vector::~Vector((Vector *)0x165a00);
  return (vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::pair<real, std::string>> FastText::getAnalogies(
		int32_t k,
		const std::string& wordA,
		const std::string& wordB,
		const std::string& wordC) {
	Vector query = Vector(args_->dim);
	query.zero();

	Vector buffer(args_->dim);
	getWordVector(buffer, wordA);
	query.addVector(buffer, 1.0 / (buffer.norm() + 1e-8));
	getWordVector(buffer, wordB);
	query.addVector(buffer, -1.0 / (buffer.norm() + 1e-8));
	getWordVector(buffer, wordC);
	query.addVector(buffer, 1.0 / (buffer.norm() + 1e-8));

	lazyComputeWordVectors();
	assert(wordVectors_);
	return getNN(*wordVectors_, query, k, {wordA, wordB, wordC});
}